

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_name(exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,
                   char *tname,int32_t attrsz)

{
  long lVar1;
  exr_result_t eVar2;
  int iVar3;
  exr_context_t in_RCX;
  exr_attribute_list_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  uint in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  int32_t n;
  uint8_t *outstr;
  exr_result_t rv;
  int32_t in_stack_ffffffffffffffc4;
  int32_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = check_bad_attrsz((_internal_exr_seq_scratch *)in_RSI,(int32_t)((ulong)in_RDX >> 0x20),
                           (int32_t)in_RDX,(char *)in_RCX,
                           (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8);
  if (eVar2 == 0) {
    lVar1._0_4_ = in_RSI->max_image_w;
    lVar1._4_4_ = in_RSI->max_image_h;
    if (lVar1 == 0) {
      iVar3 = strcmp((char *)in_RCX,"string");
      if (iVar3 == 0) {
        eVar2 = exr_attr_list_add_static_name
                          ((exr_context_t)CONCAT44(attrsz,rv),(exr_attribute_list_t *)outstr,
                           in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                           (uint8_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(exr_attribute_t **)curpart);
        if (eVar2 == 0) {
          iVar3 = (*(code *)in_RDX[1].entries)(in_RDX,in_stack_ffffffffffffffc8,(long)(int)in_R8D);
          if (iVar3 == 0) {
            *(undefined1 *)((long)in_stack_ffffffffffffffc8 + (long)(int)in_R8D) = 0;
            eVar2 = exr_attr_string_init_static_with_length
                              (in_RCX,(exr_attr_string_t *)((ulong)in_R8D << 0x20),
                               (char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
            if (eVar2 == 0) {
              eVar2 = 0;
            }
            else {
              exr_attr_list_remove(in_RSI,in_RDX,(exr_attribute_t *)in_RCX);
              in_RSI->max_image_w = 0;
              in_RSI->max_image_h = 0;
              eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,eVar2,"Unable to read \'name\' data");
            }
          }
          else {
            exr_attr_list_remove(in_RSI,in_RDX,(exr_attribute_t *)in_RCX);
            in_RSI->max_image_w = 0;
            in_RSI->max_image_h = 0;
            eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,iVar3,"Unable to read \'name\' data");
          }
        }
        else {
          (*(code *)in_RDX[1].sorted_entries)(in_RDX,in_R8D);
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,eVar2,"Unable to initialize attribute \'%s\', type \'string\'",
                             "name");
        }
      }
      else {
        (*(code *)in_RDX[1].sorted_entries)(in_RDX,in_R8D);
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0x10,"attribute \'name\': Invalid type \'%s\'",in_RCX);
      }
    }
    else {
      (*(code *)in_RDX[1].sorted_entries)(in_RDX,in_R8D);
      eVar2 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Duplicate copy of required attribute \'name\' encountered");
    }
  }
  return eVar2;
}

Assistant:

static exr_result_t
check_populate_name (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;
    uint8_t*     outstr;
    int32_t      n;

    rv = check_bad_attrsz (scratch, attrsz, 1, EXR_REQ_NAME_STR, tname, &n);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (curpart->name)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Duplicate copy of required attribute 'name' encountered");
    }

    if (0 != strcmp (tname, "string"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "attribute 'name': Invalid type '%s'",
            tname);
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_NAME_STR,
        EXR_ATTR_STRING,
        attrsz + 1,
        &outstr,
        &(curpart->name));
    if (rv != EXR_ERR_SUCCESS)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'string'",
            EXR_REQ_NAME_STR);
    }

    rv = scratch->sequential_read (scratch, outstr, (uint64_t) attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (ctxt, &(curpart->attributes), curpart->name);
        curpart->name = NULL;
        return ctxt->report_error (ctxt, rv, "Unable to read 'name' data");
    }
    outstr[attrsz] = '\0';

    rv = exr_attr_string_init_static_with_length (
        ctxt, curpart->name->string, (const char*) outstr, attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (
            (exr_context_t) ctxt, &(curpart->attributes), curpart->name);
        curpart->name = NULL;
        return ctxt->report_error (ctxt, rv, "Unable to read 'name' data");
    }

    return rv;
}